

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestacceptorFixturebadCompID::~TestacceptorFixturebadCompID
          (TestacceptorFixturebadCompID *this)

{
  TestacceptorFixturebadCompID *this_local;
  
  ~TestacceptorFixturebadCompID(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, badCompID)
{
  object->setResponder( this );
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  object->next( createNewOrderSingle( "ISLD", "WT", 3 ), UtcTimeStamp() );
  CHECK_EQUAL( 1, toReject );
  CHECK_EQUAL( 1, toLogout );
  CHECK_EQUAL( 0, disconnected );

  object->next( createLogout( "ISLD", "TW", 4 ), UtcTimeStamp() );
  CHECK_EQUAL( 1, toLogout );
  CHECK_EQUAL( 1, disconnected );
}